

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

region * __thiscall
toml::detail::maybe::scan(region *__return_storage_ptr__,maybe *this,location *loc)

{
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  location first;
  region reg;
  location lStack_c8;
  region local_80;
  
  location::location(&lStack_c8,loc);
  _Var1._M_head_impl =
       (this->other_).scanner_._M_t.
       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_scanner_base[2])(&local_80,_Var1._M_head_impl,loc);
  if (local_80.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    location::operator=(loc,&lStack_c8);
  }
  region::region(__return_storage_ptr__,&lStack_c8,loc);
  region::~region(&local_80);
  location::~location(&lStack_c8);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region maybe::scan(location& loc) const
{
    const auto first = loc;
    const auto reg = other_.scan(loc);
    if( ! reg.is_ok())
    {
        loc = first;
    }
    return region(first, loc);
}